

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall kj::Path::evalPart(Path *this,Vector<kj::String> *parts,ArrayPtr<const_char> part)

{
  String *pSVar1;
  String *pSVar2;
  undefined8 *puVar3;
  char *pcVar4;
  size_t sVar5;
  Fault FVar6;
  Fault f;
  Exception *pEStack_a0;
  ArrayDisposer *pAStack_98;
  Fault f_1;
  DebugComparison<unsigned_long,_int> _kjCondition;
  String local_58;
  String local_38;
  
  pcVar4 = part.ptr;
  if (pcVar4 != (char *)0x0) {
    if (pcVar4 == (char *)0x2) {
      if ((*(char *)&(parts->builder).ptr == '.') &&
         (*(char *)((long)&(parts->builder).ptr + 1) == '.')) {
        pSVar1 = (String *)(this->parts).size_;
        pSVar2 = (this->parts).ptr;
        _kjCondition.left = ((long)pSVar1 - (long)pSVar2 >> 3) * -0x5555555555555555;
        _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
        _kjCondition.op.content.ptr = " > ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = pSVar1 != pSVar2;
        if (!_kjCondition.result) {
          _::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[50]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x13f,FAILED,"parts.size() > 0",
                     "_kjCondition,\"can\'t use \\\"..\\\" to break out of starting directory\"",
                     &_kjCondition,
                     (char (*) [50])"can\'t use \"..\" to break out of starting directory");
          _::Debug::Fault::~Fault(&f);
          return;
        }
        ArrayBuilder<kj::String>::removeLast((ArrayBuilder<kj::String> *)this);
        return;
      }
    }
    else if ((pcVar4 == (char *)0x1) && (*(char *)&(parts->builder).ptr == '.')) {
      return;
    }
    heapString((String *)&f,(char *)parts,(size_t)pcVar4);
    FVar6.exception = pEStack_a0;
    if (pEStack_a0 != (Exception *)0x0) {
      FVar6 = f;
    }
    _kjCondition.left = strlen((char *)FVar6.exception);
    _kjCondition._8_8_ = (undefined1 *)0x0;
    if (pEStack_a0 != (Exception *)0x0) {
      _kjCondition._8_8_ = (undefined1 *)((long)&pEStack_a0[-1].details.builder.disposer + 7);
    }
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == _kjCondition._8_8_;
    if (!_kjCondition.result) {
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[32],kj::String&>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x146,FAILED,"strlen(str.begin()) == str.size()",
                 "_kjCondition,\"NUL character in path component\", str",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
                 (char (*) [32])"NUL character in path component",(String *)&f);
      local_58.content.ptr = (char *)f.exception;
      local_58.content.size_ = (size_t)pEStack_a0;
      local_58.content.disposer = pAStack_98;
      f.exception = (Exception *)0x0;
      stripNul(&local_38,&local_58);
      FVar6 = f;
      if (f.exception != (Exception *)0x0) {
        f.exception = (Exception *)0x0;
        (**pAStack_98->_vptr_ArrayDisposer)(pAStack_98,FVar6.exception,1,0,0,0);
      }
      sVar5 = local_58.content.size_;
      pcVar4 = local_58.content.ptr;
      f.exception = (Exception *)local_38.content.ptr;
      pEStack_a0 = (Exception *)local_38.content.size_;
      pAStack_98 = local_38.content.disposer;
      local_38.content.ptr = (char *)0x0;
      local_38.content.size_ = 0;
      if ((Exception *)local_58.content.ptr != (Exception *)0x0) {
        local_58.content.ptr = (char *)0x0;
        local_58.content.size_ = 0;
        (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                  (local_58.content.disposer,pcVar4,1,sVar5,sVar5,0);
      }
      _::Debug::Fault::~Fault(&f_1);
    }
    pSVar1 = (String *)(this->parts).disposer;
    if ((String *)(this->parts).size_ == pSVar1) {
      pSVar2 = (this->parts).ptr;
      sVar5 = 4;
      if (pSVar1 != pSVar2) {
        sVar5 = ((long)pSVar1 - (long)pSVar2 >> 3) * 0x5555555555555556;
      }
      Vector<kj::String>::setCapacity((Vector<kj::String> *)this,sVar5);
    }
    puVar3 = (undefined8 *)(this->parts).size_;
    *puVar3 = f.exception;
    puVar3[1] = pEStack_a0;
    puVar3[2] = pAStack_98;
    (this->parts).size_ = (size_t)(puVar3 + 3);
  }
  return;
}

Assistant:

void Path::evalPart(Vector<String>& parts, ArrayPtr<const char> part) {
  if (part.size() == 0) {
    // Ignore consecutive or trailing '/'s.
  } else if (part.size() == 1 && part[0] == '.') {
    // Refers to current directory; ignore.
  } else if (part.size() == 2 && part[0] == '.' && part [1] == '.') {
    KJ_REQUIRE(parts.size() > 0, "can't use \"..\" to break out of starting directory") {
      // When exceptions are disabled, ignore.
      return;
    }
    parts.removeLast();
  } else {
    auto str = heapString(part);
    KJ_REQUIRE(strlen(str.begin()) == str.size(), "NUL character in path component", str) {
      // When exceptions are disabled, strip out '\0' chars.
      str = stripNul(kj::mv(str));
      break;
    }
    parts.add(kj::mv(str));
  }
}